

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O3

void __thiscall QUrlModel::layoutChanged(QUrlModel *this)

{
  QList<QUrlModel::WatchItem> *this_00;
  iterator path_00;
  iterator iVar1;
  long lVar2;
  add_const_t<QList<QUrlModel::WatchItem>_> *__range1;
  QString *path;
  QString *args;
  long in_FS_OFFSET;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_98;
  QArrayData *local_90;
  char16_t *local_88;
  qsizetype local_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  QAbstractItemModel *local_68;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)0x0;
  local_58.size = 0;
  this_00 = &this->watching;
  QList<QString>::reserve((QList<QString> *)&local_58,(this->watching).d.size);
  lVar2 = (this->watching).d.size;
  if (lVar2 != 0) {
    args = &((this->watching).d.ptr)->path;
    lVar2 = lVar2 * 0x30;
    do {
      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                ((QMovableArrayOps<QString> *)&local_58,local_58.size,args);
      QList<QString>::end((QList<QString> *)&local_58);
      args = args + 2;
      lVar2 = lVar2 + -0x30;
    } while (lVar2 != 0);
  }
  QList<QUrlModel::WatchItem>::clear(this_00);
  path_00 = QList<QString>::begin((QList<QString> *)&local_58);
  iVar1 = QList<QString>::end((QList<QString> *)&local_58);
  if (path_00.i != iVar1.i) {
    do {
      local_68 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      QFileSystemModel::index((QString *)&local_78,(int)this->fileSystemModel);
      local_98.ptr = local_68;
      local_a8 = local_78;
      puStack_a0 = puStack_70;
      local_90 = &(((path_00.i)->d).d)->super_QArrayData;
      local_88 = ((path_00.i)->d).ptr;
      local_80 = ((path_00.i)->d).size;
      if (local_90 != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&local_90->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&local_90->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QtPrivate::QMovableArrayOps<QUrlModel::WatchItem>::emplace<QUrlModel::WatchItem>
                ((QMovableArrayOps<QUrlModel::WatchItem> *)this_00,(this->watching).d.size,
                 (WatchItem *)&local_a8);
      QList<QUrlModel::WatchItem>::end(this_00);
      if (local_90 != (QArrayData *)0x0) {
        LOCK();
        (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_90,2,0x10);
        }
      }
      if (((-1 < (int)local_78) && (-1 < (long)local_78)) && (local_68 != (QAbstractItemModel *)0x0)
         ) {
        changed(this,path_00.i);
      }
      path_00.i = path_00.i + 1;
    } while (path_00.i != iVar1.i);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUrlModel::layoutChanged()
{
    QStringList paths;
    paths.reserve(watching.size());
    for (const WatchItem &item : std::as_const(watching))
        paths.append(item.path);
    watching.clear();
    for (const auto &path : paths) {
        QModelIndex newIndex = fileSystemModel->index(path);
        watching.append({newIndex, path});
        if (newIndex.isValid())
            changed(path);
     }
}